

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O2

int ext_loader_impl_discover(loader_impl impl,loader_handle handle,context ctx)

{
  loader_impl_ext_handle_lib_type *plVar1;
  dynlink_symbol_addr p_Var2;
  loader_impl_ext_handle_lib_type *plVar3;
  int iVar4;
  loader_impl_ext_handle_lib_type *plVar5;
  undefined8 uVar6;
  loader_impl_ext_handle_lib_type ext;
  loader_impl_ext_handle_lib_type local_60;
  
  plVar1 = *(loader_impl_ext_handle_lib_type **)((long)handle + 8);
  plVar3 = *handle;
  do {
    plVar5 = plVar3;
    if (plVar5 == plVar1) break;
    loader_impl_ext_handle_lib_type::loader_impl_ext_handle_lib_type(&local_60,plVar5);
    p_Var2 = local_60.addr;
    uVar6 = loader_impl_handle_container_of(impl,handle);
    iVar4 = (*p_Var2)(impl,uVar6);
    std::__cxx11::string::~string((string *)&local_60);
    plVar3 = plVar5 + 1;
  } while (iVar4 == 0);
  return (int)(plVar5 != plVar1);
}

Assistant:

int ext_loader_impl_discover(loader_impl impl, loader_handle handle, context ctx)
{
	loader_impl_ext_handle ext_handle = static_cast<loader_impl_ext_handle>(handle);

	(void)ctx; /* We have opted by pass the handle instead of the context of the handle */

	for (auto ext : ext_handle->extensions)
	{
		loader_impl_function_cast function_cast;

		function_cast.ptr = ext.addr;

		if (function_cast.fn(impl, loader_impl_handle_container_of(impl, handle)) != 0)
		{
			return 1;
		}
	}

	return 0;
}